

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

void __thiscall
icu_63::FormatParser::getQuoteLiteral(FormatParser *this,UnicodeString *quote,int32_t *itemIndex)

{
  char16_t cVar1;
  int iVar2;
  int local_24;
  int32_t i;
  int32_t *itemIndex_local;
  UnicodeString *quote_local;
  FormatParser *this_local;
  
  local_24 = *itemIndex;
  icu_63::UnicodeString::remove(quote,(char *)quote);
  cVar1 = icu_63::UnicodeString::charAt
                    ((UnicodeString *)(&this->field_0x8 + (long)local_24 * 0x40),0);
  if (cVar1 == L'\'') {
    icu_63::UnicodeString::operator+=
              (quote,(UnicodeString *)(&this->field_0x8 + (long)local_24 * 0x40));
    local_24 = local_24 + 1;
  }
LAB_003a9187:
  do {
    if (this->itemNumber <= local_24) {
LAB_003a928f:
      *itemIndex = local_24;
      return;
    }
    cVar1 = icu_63::UnicodeString::charAt
                      ((UnicodeString *)(&this->field_0x8 + (long)local_24 * 0x40),0);
    if (cVar1 != L'\'') {
      icu_63::UnicodeString::operator+=
                (quote,(UnicodeString *)(&this->field_0x8 + (long)local_24 * 0x40));
      local_24 = local_24 + 1;
      goto LAB_003a9187;
    }
    if ((this->itemNumber <= local_24 + 1) ||
       (cVar1 = icu_63::UnicodeString::charAt
                          ((UnicodeString *)(&this->field_0x8 + (long)(local_24 + 1) * 0x40),0),
       cVar1 != L'\'')) {
      icu_63::UnicodeString::operator+=
                (quote,(UnicodeString *)(&this->field_0x8 + (long)local_24 * 0x40));
      goto LAB_003a928f;
    }
    iVar2 = local_24 + 1;
    icu_63::UnicodeString::operator+=
              (quote,(UnicodeString *)(&this->field_0x8 + (long)local_24 * 0x40));
    local_24 = local_24 + 2;
    icu_63::UnicodeString::operator+=
              (quote,(UnicodeString *)(&this->field_0x8 + (long)iVar2 * 0x40));
  } while( true );
}

Assistant:

void
FormatParser::getQuoteLiteral(UnicodeString& quote, int32_t *itemIndex) {
    int32_t i = *itemIndex;

    quote.remove();
    if (items[i].charAt(0)==SINGLE_QUOTE) {
        quote += items[i];
        ++i;
    }
    while ( i < itemNumber ) {
        if ( items[i].charAt(0)==SINGLE_QUOTE ) {
            if ( (i+1<itemNumber) && (items[i+1].charAt(0)==SINGLE_QUOTE)) {
                // two single quotes e.g. 'o''clock'
                quote += items[i++];
                quote += items[i++];
                continue;
            }
            else {
                quote += items[i];
                break;
            }
        }
        else {
            quote += items[i];
        }
        ++i;
    }
    *itemIndex=i;
}